

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate2<std::complex<double>_>::QRotationGate2
          (QRotationGate2<std::complex<double>_> *this)

{
  QRotationGate2<std::complex<double>_> *this_local;
  
  QGate2<std::complex<double>_>::QGate2(&this->super_QGate2<std::complex<double>_>);
  QAdjustable::QAdjustable(&this->super_QAdjustable,false);
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00759d10;
  (this->qubits_)._M_elems[0] = 0;
  (this->qubits_)._M_elems[1] = 1;
  QRotation<double>::QRotation(&this->rotation_);
  return;
}

Assistant:

QRotationGate2()
        : qubits_( { 0 , 1 } )
        , rotation_()
        , QAdjustable()
        { }